

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Auth.cpp
# Opt level: O2

Url * __thiscall Vault::Sys::Auth::getUrl(Url *__return_storage_ptr__,Auth *this,Path *path)

{
  long *plVar1;
  size_type sVar2;
  allocator<char> local_81;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40 [32];
  
  plVar1 = *(long **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/sys/auth",&local_81);
  sVar2 = (path->value_)._M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::string((string *)&local_60,(string *)path);
  }
  else {
    Vault::operator+(&local_80,"/",path);
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_50._8_8_ = local_80.field_2._8_8_;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_80._M_dataplus._M_p;
    }
    local_58 = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (sVar2 != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Auth::getUrl(const Path &path) const {
  return client_.getUrl("/v1/sys/auth", path.empty() ? path : Path{"/" + path});
}